

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ClassConfidenceThresholding::ByteSizeLong(ClassConfidenceThresholding *this)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  Rep *pRVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  
  lVar8 = (long)(this->precisionrecallcurves_).super_RepeatedPtrFieldBase.current_size_;
  sVar7 = lVar8 * 2;
  pRVar5 = (this->precisionrecallcurves_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    pRVar5 = (Rep *)pRVar5->elements;
  }
  if (lVar8 != 0) {
    lVar6 = 0;
    do {
      sVar4 = PrecisionRecallCurve::ByteSizeLong
                        (*(PrecisionRecallCurve **)((long)pRVar5->elements + lVar6 + -8));
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar7 = sVar7 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      lVar6 = lVar6 + 8;
    } while (lVar8 * 8 != lVar6);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar7 = sVar7 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar7;
  return sVar7;
}

Assistant:

size_t ClassConfidenceThresholding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ClassConfidenceThresholding)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.PrecisionRecallCurve precisionRecallCurves = 100;
  total_size += 2UL * this->_internal_precisionrecallcurves_size();
  for (const auto& msg : this->precisionrecallcurves_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}